

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Handler.cpp
# Opt level: O0

void __thiscall Handler::Migrate(Handler *this)

{
  bool bVar1;
  size_type sVar2;
  Handler *in_RDI;
  PurchasedServer *destPurchasedServer;
  int mid;
  int right;
  int left;
  uint32_t *deployedVMIdx;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *deployedVM;
  PurchasedServer *originPurchasedServer;
  int i;
  bool ended;
  uint32_t migrateNum;
  uint32_t threshold;
  undefined4 in_stack_ffffffffffffff28;
  LOCATION in_stack_ffffffffffffff2c;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *__lhs;
  byte local_c1;
  reference in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff60;
  _Node_iterator_base<unsigned_int,_false> in_stack_ffffffffffffff68;
  _Node_iterator_base<unsigned_int,_false> in_stack_ffffffffffffff70;
  Handler *this_00;
  undefined1 local_69 [9];
  _Node_iterator_base<unsigned_int,_false> local_60;
  undefined1 local_58 [32];
  reference local_38;
  int local_30;
  PurchasedServer *local_28;
  PurchasedServer *local_20;
  byte local_11;
  uint local_10;
  uint local_c;
  
  local_c = (in_RDI->deployedVMNum * 3) / 100;
  local_10 = 0;
  local_11 = local_c == 0;
  if (!(bool)local_11) {
    local_20 = (PurchasedServer *)
               std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>::begin
                         ((vector<PurchasedServer,_std::allocator<PurchasedServer>_> *)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    local_28 = (PurchasedServer *)
               std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>::end
                         ((vector<PurchasedServer,_std::allocator<PurchasedServer>_> *)
                          CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    std::
    sort<__gnu_cxx::__normal_iterator<PurchasedServer*,std::vector<PurchasedServer,std::allocator<PurchasedServer>>>,Handler::Migrate()::__0>
              (local_20,local_28);
    ReMapPurchasedServerIdx(in_RDI);
    sVar2 = std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>::size
                      (&in_RDI->purchasedServers);
    local_30 = (int)sVar2;
    while( true ) {
      local_30 = local_30 + -1;
      local_c1 = 0;
      if (-1 < local_30) {
        local_c1 = local_11 ^ 0xff;
      }
      if ((local_c1 & 1) == 0) break;
      local_38 = std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>::operator[]
                           (&in_RDI->purchasedServers,(long)local_30);
      local_58._24_8_ = &local_38->deployedVM;
      local_60._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      local_69._1_8_ =
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      __lhs = (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               *)local_69;
      std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x129f85);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<std::__detail::_Node_iterator<unsigned_int,true,false>,void>
                (in_stack_ffffffffffffff60,
                 (_Node_iterator<unsigned_int,_true,_false>)in_stack_ffffffffffffff70._M_cur,
                 (_Node_iterator<unsigned_int,_true,_false>)in_stack_ffffffffffffff68._M_cur,
                 (allocator_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x129fad);
      SortDeployedVM((Handler *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     in_stack_ffffffffffffff48);
      this_00 = (Handler *)local_58;
      in_stack_ffffffffffffff70._M_cur =
           (__node_type *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      in_stack_ffffffffffffff68._M_cur =
           (__node_type *)
           std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      while ((bVar1 = __gnu_cxx::operator!=
                                (__lhs,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                        *)CONCAT44(in_stack_ffffffffffffff2c,
                                                   in_stack_ffffffffffffff28)), bVar1 &&
             (in_stack_ffffffffffffff60 =
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   __gnu_cxx::
                   __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                   ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&stack0xffffffffffffff70), (local_11 & 1) == 0))) {
        in_stack_ffffffffffffff5c = 0;
        in_stack_ffffffffffffff58 = local_30;
        while (in_stack_ffffffffffffff5c < in_stack_ffffffffffffff58) {
          in_stack_ffffffffffffff54 = (in_stack_ffffffffffffff5c + in_stack_ffffffffffffff58) / 2;
          in_stack_ffffffffffffff48 =
               std::vector<PurchasedServer,_std::allocator<PurchasedServer>_>::operator[]
                         (&in_RDI->purchasedServers,(long)in_stack_ffffffffffffff54);
          in_stack_ffffffffffffff2c =
               Migrate(this_00,(PurchasedServer *)in_stack_ffffffffffffff70._M_cur,
                       (PurchasedServer *)in_stack_ffffffffffffff68._M_cur,
                       (uint32_t *)in_stack_ffffffffffffff60);
          if (in_stack_ffffffffffffff2c != NONE) {
            local_10 = local_10 + 1;
            if (local_c <= local_10) {
              local_11 = 1;
            }
            break;
          }
          in_stack_ffffffffffffff5c = in_stack_ffffffffffffff54 + 1;
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      *)&stack0xffffffffffffff70);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI);
    }
    in_RDI->totalMigrationNum = local_10 + in_RDI->totalMigrationNum;
  }
  return;
}

Assistant:

void Handler::Migrate() {
    uint32_t threshold = deployedVMNum * 3u / 100u;
    uint32_t migrateNum = 0u;
    bool ended = (migrateNum >= threshold);
    if (ended) return;

    // 将 purchasedServers 按照剩余容量升序排列
    std::sort(purchasedServers.begin(), purchasedServers.end(), [](const PurchasedServer &a, const PurchasedServer &b) {
        return a.vacancyRate != b.vacancyRate ? a.vacancyRate < b.vacancyRate :
               a.remainCpuCoreA + a.remainCpuCoreB + a.remainMemorySizeA + a.remainMemorySizeB <
               b.remainCpuCoreA + b.remainCpuCoreB + b.remainMemorySizeA + b.remainMemorySizeB;;
    });
    // 排序后需要重新映射 purchasedServer id -> purchasedServers index
    ReMapPurchasedServerIdx();

    // originPurchasedServer -> destPurchasedServer
    for (int i = (int) purchasedServers.size() - 1; i >= 0 && !ended; --i) {
        PurchasedServer &originPurchasedServer = purchasedServers[i];
        std::unordered_set<uint32_t> &deployedVM = originPurchasedServer.deployedVM;
        std::vector<uint32_t> tmp(deployedVM.begin(), deployedVM.end());
        SortDeployedVM(tmp);

        for (const uint32_t &deployedVMIdx : tmp) {
            if (ended) break;

            int left = 0, right = i, mid;
            while (left < right) {
                mid = (left + right) / 2;
                PurchasedServer &destPurchasedServer = purchasedServers[mid];
                if (Migrate(originPurchasedServer, destPurchasedServer, deployedVMIdx) != NONE) {
                    if (++migrateNum >= threshold) ended = true;
                    break;
                } else {
                    left = mid + 1;
                }
            }
        }
    }

#ifdef TEST
    totalMigrationNum += migrateNum;
#endif
}